

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.cc
# Opt level: O2

EVP_PKEY * EVP_PKEY_new_raw_public_key(int type,ENGINE *unused,uint8_t *in,size_t len)

{
  int iVar1;
  _Head_base<0UL,_evp_pkey_st_*,_false> pkey;
  pointer __p;
  EVP_PKEY_ASN1_METHOD *method;
  UniquePtr<EVP_PKEY> ret;
  
  if (type == 0x3b4) {
    method = &x25519_asn1_meth;
  }
  else {
    if (type != 0x3b5) {
      ERR_put_error(6,0,0x80,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp.cc"
                    ,0x115);
      return (EVP_PKEY *)0x0;
    }
    method = &ed25519_asn1_meth;
  }
  pkey._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
  ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)pkey._M_head_impl;
  if ((tuple<evp_pkey_st_*,_bssl::internal::Deleter>)pkey._M_head_impl !=
      (_Head_base<0UL,_evp_pkey_st_*,_false>)0x0) {
    evp_pkey_set_method(pkey._M_head_impl,method);
    iVar1 = (*(pkey._M_head_impl)->ameth->set_pub_raw)(pkey._M_head_impl,in,len);
    if (iVar1 != 0) {
      ret._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>)0x0;
      goto LAB_0017e7d3;
    }
  }
  pkey._M_head_impl = (evp_pkey_st *)0x0;
LAB_0017e7d3:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&ret);
  return pkey._M_head_impl;
}

Assistant:

EVP_PKEY *EVP_PKEY_new_raw_public_key(int type, ENGINE *unused,
                                      const uint8_t *in, size_t len) {
  // To avoid pulling in all key types, look for specifically the key types that
  // support |set_pub_raw|.
  const EVP_PKEY_ASN1_METHOD *method;
  switch (type) {
    case EVP_PKEY_X25519:
      method = &x25519_asn1_meth;
      break;
    case EVP_PKEY_ED25519:
      method = &ed25519_asn1_meth;
      break;
    default:
      OPENSSL_PUT_ERROR(EVP, EVP_R_UNSUPPORTED_ALGORITHM);
      return nullptr;
  }

  bssl::UniquePtr<EVP_PKEY> ret(EVP_PKEY_new());
  if (ret == nullptr) {
    return nullptr;
  }
  evp_pkey_set_method(ret.get(), method);

  if (!ret->ameth->set_pub_raw(ret.get(), in, len)) {
    return nullptr;
  }

  return ret.release();
}